

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::UniformLocMixWithImplicit::Run(UniformLocMixWithImplicit *this)

{
  long lVar1;
  DefOccurence local_818;
  DefOccurence local_814;
  LayoutSpecifierBase local_810;
  DefOccurence local_7fc;
  LayoutSpecifierBase local_7f8;
  UniformType local_7e8;
  Uniform local_758;
  LayoutSpecifierBase local_580;
  DefOccurence local_570;
  DefOccurence local_56c;
  LayoutSpecifierBase local_568;
  DefOccurence local_554;
  LayoutSpecifierBase local_550;
  UniformType local_540;
  Uniform local_4b0;
  LayoutSpecifierBase local_2d8;
  DefOccurence local_2c8;
  DefOccurence local_2c4;
  LayoutSpecifierBase local_2c0;
  DefOccurence local_2ac;
  LayoutSpecifierBase local_2a8;
  UniformType local_290;
  Uniform local_200;
  undefined1 local_28 [8];
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  UniformLocMixWithImplicit *this_local;
  
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
            *)local_28);
  UniformType::UniformType(&local_290,0x1406,0);
  DefOccurence::DefOccurence(&local_2ac,FSH_OR_CSH);
  local_2c0 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(0,local_2ac);
  local_2a8 = local_2c0;
  DefOccurence::DefOccurence(&local_2c4,ALL_SH);
  DefOccurence::DefOccurence(&local_2c8,ALL_SH);
  local_2d8 = local_2a8;
  anon_unknown_0::Uniform::Uniform
            (&local_200,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_290,(Loc)local_2a8,local_2c4,local_2c8);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_200);
  anon_unknown_0::Uniform::~Uniform(&local_200);
  UniformType::~UniformType(&local_290);
  UniformType::UniformType(&local_540,0x8b51,0);
  DefOccurence::DefOccurence(&local_554,FSH_OR_CSH);
  local_568 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(2,local_554);
  local_550 = local_568;
  DefOccurence::DefOccurence(&local_56c,ALL_SH);
  DefOccurence::DefOccurence(&local_570,ALL_SH);
  local_580 = local_550;
  anon_unknown_0::Uniform::Uniform
            (&local_4b0,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_540,(Loc)local_550,local_56c,local_570);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_4b0);
  anon_unknown_0::Uniform::~Uniform(&local_4b0);
  UniformType::~UniformType(&local_540);
  UniformType::UniformType(&local_7e8,0x1404,0);
  DefOccurence::DefOccurence(&local_7fc,FSH_OR_CSH);
  local_810 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(3,local_7fc);
  local_7f8 = local_810;
  DefOccurence::DefOccurence(&local_814,ALL_SH);
  DefOccurence::DefOccurence(&local_818,ALL_SH);
  anon_unknown_0::Uniform::Uniform
            (&local_758,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_7e8,(Loc)local_7f8,local_814,local_818);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_758);
  anon_unknown_0::Uniform::~Uniform(&local_758);
  UniformType::~UniformType(&local_7e8);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                      *)local_28);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
             *)local_28);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//layout (location = 0) uniform float     u0;
		//layout (location = 2) uniform vec3      u1;
		//layout (location = 3) uniform int       u2;

		//uniform float     u0;
		//uniform vec3      u1;
		//uniform int       u2;
		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(0, DefOccurence::FSH_OR_CSH)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_VEC3, Loc::C(2, DefOccurence::FSH_OR_CSH)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_INT, Loc::C(3, DefOccurence::FSH_OR_CSH)));
		return doRun(uniforms);
	}